

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# potions.cpp
# Opt level: O2

int turn_see(int turn_off)

{
  int iVar1;
  int iVar2;
  MonsterThing *mp;
  bool bVar3;
  int iVar4;
  uint uVar5;
  list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *plVar6;
  iterator __end1;
  int local_34;
  
  local_34 = 0;
  plVar6 = &mlist_abi_cxx11_;
  while (plVar6 = (list<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                  (((_List_base<MonsterThing_*,_std::allocator<MonsterThing_*>_> *)
                   &((_List_node_base *)plVar6)->_M_next)->_M_impl)._M_node.super__List_node_base.
                  _M_next, plVar6 != &mlist_abi_cxx11_) {
    mp = *(MonsterThing **)((long)plVar6 + 0x10);
    bVar3 = see_monst(mp);
    if (turn_off == 0) {
      iVar1 = (mp->pos).x;
      iVar2 = (mp->pos).y;
      if (bVar3) {
        if (((uint)player.flags >> 0xb & 1) == 0) {
          iVar4 = (int)mp->type;
        }
        else {
          iVar4 = rnd(0x1a);
          iVar4 = iVar4 + 0x41;
        }
        setMapDisplay(iVar1,iVar2,iVar4);
      }
      else {
        if (((uint)player.flags >> 0xb & 1) == 0) {
          uVar5 = (uint)mp->type;
        }
        else {
          iVar4 = rnd(0x1a);
          uVar5 = iVar4 + 0x41;
        }
        setMapDisplay(iVar1,iVar2,uVar5 | 0x100);
        local_34 = 1;
      }
    }
    else if (!bVar3) {
      iVar1 = (mp->pos).x;
      iVar2 = (mp->pos).y;
      setMapDisplay(iVar1,iVar2,(int)places[iVar1 * 0x20 + iVar2].p_ch);
    }
  }
  player.flags = (uint)(turn_off == 0) << 0xe | player.flags & 0xffffbfffU;
  return local_34;
}

Assistant:

int turn_see(int turn_off)
{
    bool can_see, add_new;

    add_new = false;
    for (MonsterThing* mp : mlist)
    {
        can_see = see_monst(mp);
        if (turn_off)
        {
            if (!can_see)
                setMapDisplay(mp->pos.x, mp->pos.y, char_at(mp->pos.x, mp->pos.y));
        }
        else
        {
            if (!can_see)
            {
                if (!on(player, ISHALU))
                    setMapDisplay(mp->pos.x, mp->pos.y, mp->type | DISPLAY_INVERT);
                else
                    setMapDisplay(mp->pos.x, mp->pos.y, (rnd(26) + 'A')  | DISPLAY_INVERT);
                add_new++;
            }else{
                if (!on(player, ISHALU))
                    setMapDisplay(mp->pos.x, mp->pos.y, mp->type);
                else
                    setMapDisplay(mp->pos.x, mp->pos.y, rnd(26) + 'A');
            }
        }
    }
    if (turn_off)
        player.flags &= ~SEEMONST;
    else
        player.flags |= SEEMONST;
    return add_new;
}